

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O3

Vec_Wrd_t * Gia_ManSimPatSim2(Gia_Man_t *pGia)

{
  int iVar1;
  Vec_Wrd_t *vSimsIn;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  ulong uVar4;
  int *piVar5;
  int iVar6;
  int nWords;
  int iVar7;
  Vec_Wrd_t *vSims;
  word *__s;
  ulong uVar8;
  long lVar9;
  word *pwVar10;
  int iVar11;
  word *pwVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  int iVar19;
  word *pSims;
  uint uVar18;
  
  vSimsIn = pGia->vSimsPi;
  iVar1 = vSimsIn->nSize;
  iVar11 = pGia->vCis->nSize;
  uVar8 = (long)iVar1 / (long)iVar11;
  nWords = (int)uVar8;
  iVar19 = pGia->nObjs * nWords;
  iVar6 = iVar19 * 2;
  vSims = (Vec_Wrd_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar19 * 2 - 1U) {
    iVar7 = iVar6;
  }
  vSims->nCap = iVar7;
  if (iVar7 == 0) {
    __s = (word *)0x0;
  }
  else {
    __s = (word *)malloc((long)iVar7 << 3);
  }
  vSims->pArray = __s;
  vSims->nSize = iVar6;
  memset(__s,0,(long)iVar6 << 3);
  if (iVar1 % iVar11 != 0) {
    __assert_fail("Vec_WrdSize(pGia->vSimsPi) % Gia_ManCiNum(pGia) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0xce,"Vec_Wrd_t *Gia_ManSimPatSim2(Gia_Man_t *)");
  }
  Gia_ManSimPatAssignInputs2(pGia,nWords,vSims,vSimsIn);
  iVar1 = pGia->nObjs;
  uVar8 = uVar8 & 0xffffffff;
  if ((0 < (long)iVar1) && (pGVar2 = pGia->pObjs, pGVar2 != (Gia_Obj_t *)0x0)) {
    lVar9 = (long)nWords;
    pwVar10 = __s + lVar9;
    iVar11 = 0;
    lVar14 = 0;
    pwVar12 = __s;
    do {
      uVar13 = *(ulong *)(pGVar2 + lVar14);
      uVar15 = (uint)uVar13;
      if ((~uVar15 & 0x1fffffff) != 0 && -1 < (int)uVar15) {
        uVar15 = uVar15 & 0x1fffffff;
        if ((int)((int)lVar14 - uVar15) < 0) goto LAB_007d1b38;
        uVar18 = (uint)(uVar13 >> 0x20);
        uVar17 = uVar18 & 0x1fffffff;
        if ((int)((int)lVar14 - uVar17) < 0) goto LAB_007d1b38;
        if (uVar15 < uVar17) {
          __assert_fail("!Gia_ObjIsXor(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                        ,0xb5,
                        "void Gia_ManSimPatSimAnd2(Gia_Man_t *, int, Gia_Obj_t *, int, Vec_Wrd_t *)"
                       );
        }
        if (0 < nWords) {
          uVar16 = 0;
          do {
            uVar3 = __s[(long)(int)(((uVar18 >> 0x1d & 1) + iVar11 + uVar17 * -2) * nWords) + uVar16
                       ];
            uVar4 = __s[(long)(int)((((uint)(uVar13 >> 0x1d) & 1) + iVar11 + uVar15 * -2) * nWords)
                        + uVar16];
            pwVar12[uVar16] = uVar3 & uVar4;
            pwVar10[uVar16] = ~(uVar3 & uVar4);
            uVar16 = uVar16 + 1;
          } while (uVar8 != uVar16);
        }
      }
      lVar14 = lVar14 + 1;
      pwVar10 = pwVar10 + lVar9 * 2;
      pwVar12 = pwVar12 + lVar9 * 2;
      iVar11 = iVar11 + 2;
    } while (lVar14 != iVar1);
  }
  lVar9 = (long)pGia->vCos->nSize;
  if (0 < lVar9) {
    piVar5 = pGia->vCos->pArray;
    lVar14 = 0;
    do {
      iVar11 = piVar5[lVar14];
      if (((long)iVar11 < 0) || (iVar1 <= iVar11)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGia->pObjs == (Gia_Obj_t *)0x0) {
        return vSims;
      }
      uVar15 = *(uint *)(pGia->pObjs + iVar11);
      uVar17 = uVar15 & 0x1fffffff;
      if ((int)(iVar11 - uVar17) < 0) {
LAB_007d1b38:
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      if (0 < nWords) {
        uVar13 = 0;
        do {
          __s[(long)(iVar11 * nWords) + uVar13] =
               __s[(long)(int)(((uVar15 >> 0x1d & 1) + iVar11 * 2 + uVar17 * -2) * nWords) + uVar13]
          ;
          uVar13 = uVar13 + 1;
        } while (uVar8 != uVar13);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != lVar9);
  }
  return vSims;
}

Assistant:

Vec_Wrd_t * Gia_ManSimPatSim2( Gia_Man_t * pGia )
{
    Gia_Obj_t * pObj;
    int i, nWords = Vec_WrdSize(pGia->vSimsPi) / Gia_ManCiNum(pGia);
    Vec_Wrd_t * vSims = Vec_WrdStart( Gia_ManObjNum(pGia) * nWords * 2 );
    assert( Vec_WrdSize(pGia->vSimsPi) % Gia_ManCiNum(pGia) == 0 );
    Gia_ManSimPatAssignInputs2( pGia, nWords, vSims, pGia->vSimsPi );
    Gia_ManForEachAnd( pGia, pObj, i ) 
        Gia_ManSimPatSimAnd2( pGia, i, pObj, nWords, vSims );
    Gia_ManForEachCo( pGia, pObj, i )
        Gia_ManSimPatSimPo2( pGia, Gia_ObjId(pGia, pObj), pObj, nWords, vSims );
    return vSims;
}